

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

void hmac_genresult(ssh2_mac *mac,uchar *output)

{
  ssh_hash *h;
  ssh_hash *htmp;
  hmac *ctx;
  uchar *output_local;
  ssh2_mac *mac_local;
  
  ssh_hash_digest_nondestructive((ssh_hash *)mac[-2].binarysink_,(uchar *)mac[-1].vt);
  h = ssh_hash_copy((ssh_hash *)mac[-3].binarysink_);
  BinarySink_put_data(h->binarysink_,mac[-1].vt,(size_t)(mac[-3].vt)->text_name);
  ssh_hash_final(h,(uchar *)mac[-1].vt);
  memcpy(output,mac[-1].vt,(long)mac->vt->len);
  smemclr(mac[-1].vt,(size_t)(mac[-3].vt)->text_name);
  return;
}

Assistant:

static void hmac_genresult(ssh2_mac *mac, unsigned char *output)
{
    struct hmac *ctx = container_of(mac, struct hmac, mac);
    ssh_hash *htmp;

    /* Leave h_live and h_outer in place, so that the SSH-2 BPP can
     * continue regenerating test results from different-length
     * prefixes of the packet */
    ssh_hash_digest_nondestructive(ctx->h_live, ctx->digest);

    htmp = ssh_hash_copy(ctx->h_outer);
    put_data(htmp, ctx->digest, ctx->hashalg->hlen);
    ssh_hash_final(htmp, ctx->digest);

    /*
     * Some instances of HMAC truncate the output hash, so instead of
     * writing it directly to 'output' we wrote it to our own
     * full-length buffer, and now we copy the required amount.
     */
    memcpy(output, ctx->digest, mac->vt->len);
    smemclr(ctx->digest, ctx->hashalg->hlen);
}